

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SMPTEAnalyzerResults::GenerateBubbleText
          (SMPTEAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  Frame local_88 [56];
  Frame local_50 [8];
  Frame frame;
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  SMPTEAnalyzerResults *this_local;
  
  AnalyzerResults::GetFrame((ulonglong)local_50);
  AnalyzerResults::ClearResultStrings();
  Frame::Frame(local_88,local_50);
  fillSMPTE(this,local_88,(char *)0x0);
  Frame::~Frame(local_88);
  Frame::~Frame(local_50);
  return;
}

Assistant:

void SMPTEAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
	Frame frame = GetFrame( frame_index );

	ClearResultStrings();
	fillSMPTE(frame,NULL);
}